

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setListPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,ListReader value,
          BuilderArena *orphanArena,bool canonical)

{
  char *pcVar1;
  BuilderArena *this;
  word *pwVar2;
  int iVar3;
  ListElementCount LVar4;
  StructPointerCount SVar5;
  ElementSize EVar6;
  ulong uVar7;
  SegmentBuilder *pSVar8;
  word *pwVar9;
  uint uVar10;
  ListElementCount LVar11;
  void *pvVar12;
  WirePointer *pWVar13;
  WirePointer *dst;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  byte *pbVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint i;
  ElementCount index;
  long lVar22;
  byte *__src;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  SegmentAnd<capnp::word_*> SVar26;
  AllocateResult AVar27;
  word *local_e8;
  long local_e0;
  Fault f;
  StructReader element;
  
  LVar4 = value.elementCount;
  SVar5 = value.structPointerCount;
  EVar6 = value.elementSize;
  uVar23 = (ulong)value.elementCount;
  uVar21 = value.step * uVar23;
  if (uVar21 < 0x7ffffff81) {
    uVar19 = uVar21 + 0x3f >> 6;
    if (value.elementSize == INLINE_COMPOSITE) {
      uVar16 = value.structDataSize >> 6;
      if (canonical) {
        uVar7 = 0;
        if (uVar23 == 0) {
          uVar21 = 0;
        }
        else {
          uVar14 = 0;
          index = 0;
          uVar21 = uVar7;
          do {
            ListReader::getStructElement(&element,&value,index);
            pvVar12 = (void *)((ulong)(element.dataSize >> 3) + (long)element.data);
            uVar20 = (element.dataSize >> 3) + 7;
            do {
              uVar10 = uVar20;
              if (pvVar12 <= element.data) break;
              pcVar1 = (char *)((long)pvVar12 - 1);
              pvVar12 = (void *)((long)pvVar12 - 1);
              uVar20 = uVar10 - 1;
            } while (*pcVar1 == '\0');
            uVar10 = uVar10 >> 3;
            uVar7 = uVar21 & 0xffff;
            uVar21 = (ulong)uVar10;
            if (uVar10 <= (uint)uVar7) {
              uVar21 = uVar7;
            }
            lVar17 = (ulong)element.pointerCount << 3;
            do {
              lVar22 = lVar17;
              pWVar13 = (WirePointer *)((long)&((element.pointers)->offsetAndKind).value + lVar22);
              if (pWVar13 <= element.pointers) break;
              lVar17 = lVar22 + -8;
            } while (pWVar13[-1].field_1.upper32Bits == 0 && pWVar13[-1].offsetAndKind.value == 0);
            uVar7 = uVar14 & 0xffff;
            uVar14 = lVar22 >> 3;
            if (lVar22 >> 3 <= (long)uVar7) {
              uVar14 = uVar7;
            }
            index = index + 1;
          } while (index != LVar4);
          uVar7 = uVar14 & 0xffffffff;
        }
        uVar14 = ((uVar7 & 0xffff) + (uVar21 & 0xffff)) * uVar23;
        bVar25 = uVar19 <= uVar14;
        lVar17 = uVar14 - uVar19;
        uVar19 = uVar14;
        if (bVar25 && lVar17 != 0) goto LAB_002789f7;
      }
      else {
        uVar7 = (ulong)value.structPointerCount;
        uVar21 = (ulong)uVar16;
      }
      iVar3 = (int)uVar19;
      uVar20 = iVar3 + 1;
      pWVar13 = ref;
      if (orphanArena == (BuilderArena *)0x0) {
        if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
          zeroObject(segment,capTable,ref);
        }
        pwVar9 = segment->pos;
        SVar26.value = pwVar9;
        SVar26.segment = segment;
        if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                   ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >> 3 <
             (long)(ulong)uVar20) || (segment->pos = pwVar9 + uVar20, pwVar9 == (word *)0x0)) {
          this = (BuilderArena *)(segment->super_SegmentReader).arena;
          if (0x1fffffff < iVar3 + 2U) {
            allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&element);
          }
          AVar27 = BuilderArena::allocate(this,iVar3 + 2U);
          pWVar13 = (WirePointer *)AVar27.words;
          pSVar8 = AVar27.segment;
          (ref->offsetAndKind).value =
               (int)AVar27.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
          ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                         (pSVar8->super_SegmentReader).id.value;
          (pWVar13->offsetAndKind).value = 1;
          SVar26.value = (word *)(pWVar13 + 1);
          SVar26.segment = pSVar8;
        }
        else {
          (ref->offsetAndKind).value =
               ((uint)((ulong)((long)pwVar9 - (long)ref) >> 1) & 0xfffffffc) - 3;
        }
      }
      else {
        SVar26 = (SegmentAnd<capnp::word_*>)BuilderArena::allocate(orphanArena,uVar20);
        (ref->offsetAndKind).value = 0xfffffffd;
      }
      pwVar9 = SVar26.value;
      (pWVar13->field_1).upper32Bits = iVar3 * 8 + 7;
      *(ListElementCount *)&pwVar9->content = LVar4 * 4;
      *(short *)((long)&pwVar9->content + 4) = (short)uVar21;
      *(short *)((long)&pwVar9->content + 6) = (short)uVar7;
      if (uVar23 != 0) {
        local_e8 = pwVar9 + 1;
        uVar19 = (ulong)(uint)((int)(uVar21 & 0xffff) << 3);
        lVar22 = (long)&pwVar9[1].content + uVar19;
        uVar14 = (ulong)(uint)((int)(uVar7 & 0xffff) << 3);
        uVar23 = (ulong)((uVar16 & 0xffff) * 8);
        pbVar18 = value.ptr + uVar23;
        lVar17 = uVar23 + (ulong)SVar5 * 8;
        local_e0 = -8 - (long)pbVar18;
        LVar11 = 0;
        __src = value.ptr;
        do {
          if ((short)uVar21 != 0) {
            memcpy(local_e8,__src,uVar19);
          }
          if ((short)uVar7 != 0) {
            uVar23 = 0;
            lVar24 = local_e0;
            do {
              lVar15 = (long)(*(int *)(pbVar18 + uVar23) >> 2);
              if (value.segment == (SegmentReader *)0x0) {
                pwVar9 = (word *)(pbVar18 + uVar23 + lVar15 * 8 + 8);
              }
              else {
                pwVar2 = ((value.segment)->ptr).ptr;
                pwVar9 = pwVar2 + ((value.segment)->ptr).size_;
                if (((long)&pwVar2->content + lVar24 >> 3 <= lVar15) &&
                   (lVar15 <= (long)&pwVar9->content + lVar24 >> 3)) {
                  pwVar9 = (word *)(pbVar18 + uVar23 + lVar15 * 8 + 8);
                }
              }
              copyPointer(SVar26.segment,capTable,(WirePointer *)(uVar23 + lVar22),value.segment,
                          value.capTable,(WirePointer *)(pbVar18 + uVar23),pwVar9,value.nestingLimit
                          ,(BuilderArena *)0x0,canonical);
              uVar23 = uVar23 + 8;
              lVar24 = lVar24 + -8;
            } while (uVar14 != uVar23);
          }
          local_e8 = local_e8 + (uVar21 & 0xffff) + (uVar7 & 0xffff);
          __src = __src + (ulong)SVar5 * 8 + ((ulong)uVar16 & 0xffff) * 8;
          LVar11 = LVar11 + 1;
          lVar22 = lVar22 + uVar19 + uVar14;
          pbVar18 = pbVar18 + lVar17;
          local_e0 = local_e0 - lVar17;
        } while (LVar11 != LVar4);
      }
    }
    else {
      pWVar13 = ref;
      if (orphanArena == (BuilderArena *)0x0) {
        if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
          zeroObject(segment,capTable,ref);
        }
        pwVar9 = segment->pos;
        SVar26.value = pwVar9;
        SVar26.segment = segment;
        if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                   ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >> 3 <
             (long)uVar19) || (segment->pos = pwVar9 + uVar19, pwVar9 == (word *)0x0)) {
          AVar27 = BuilderArena::allocate
                             ((BuilderArena *)(segment->super_SegmentReader).arena,
                              (SegmentWordCount)uVar19 + 1);
          pWVar13 = (WirePointer *)AVar27.words;
          pSVar8 = AVar27.segment;
          (ref->offsetAndKind).value =
               (int)AVar27.words - *(int *)&(pSVar8->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
          ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                         (pSVar8->super_SegmentReader).id.value;
          (pWVar13->offsetAndKind).value = 1;
          SVar26.value = (word *)(pWVar13 + 1);
          SVar26.segment = pSVar8;
        }
        else {
          (ref->offsetAndKind).value =
               ((uint)((ulong)((long)pwVar9 - (long)ref) >> 1) & 0xfffffffc) - 3;
        }
      }
      else {
        SVar26 = (SegmentAnd<capnp::word_*>)
                 BuilderArena::allocate(orphanArena,(SegmentWordCount)uVar19);
        (ref->offsetAndKind).value = 0xfffffffd;
      }
      dst = (WirePointer *)SVar26.value;
      if (EVar6 == POINTER) {
        (pWVar13->field_1).upper32Bits = LVar4 * 8 | 6;
        if (uVar23 != 0) {
          lVar17 = 8;
          lVar22 = -8;
          do {
            lVar24 = (long)(*(int *)(value.ptr + lVar17 + -8) >> 2);
            if (value.segment == (SegmentReader *)0x0) {
              pwVar9 = (word *)(value.ptr + lVar17 + lVar24 * 8);
            }
            else {
              pwVar2 = ((value.segment)->ptr).ptr;
              pwVar9 = pwVar2 + ((value.segment)->ptr).size_;
              if (((long)pwVar2 + (lVar22 - (long)value.ptr) >> 3 <= lVar24) &&
                 (lVar24 <= (long)pwVar9 + (lVar22 - (long)value.ptr) >> 3)) {
                pwVar9 = (word *)(value.ptr + lVar17 + lVar24 * 8);
              }
            }
            copyPointer(SVar26.segment,capTable,dst,value.segment,value.capTable,
                        (WirePointer *)(value.ptr + lVar17 + -8),pwVar9,value.nestingLimit,
                        (BuilderArena *)0x0,canonical);
            dst = dst + 1;
            lVar17 = lVar17 + 8;
            lVar24 = lVar22 + uVar23 * 8;
            lVar22 = lVar22 + -8;
          } while (lVar24 != 0);
        }
      }
      else {
        (pWVar13->field_1).upper32Bits = LVar4 * 8 | (uint)EVar6;
        uVar23 = uVar21 >> 3;
        if (7 < uVar21) {
          memcpy(dst,value.ptr,uVar23);
          uVar21 = (ulong)value.step * (ulong)value.elementCount;
        }
        if ((uVar21 & 7) != 0) {
          *(byte *)((long)&(dst->offsetAndKind).value + uVar23) =
               ~(-1 << (sbyte)(uVar21 & 7)) & value.ptr[uVar23];
        }
      }
    }
    return SVar26;
  }
  setListPointer::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)segment);
LAB_002789f7:
  f.exception = (Exception *)0x0;
  element.segment = (SegmentReader *)0x0;
  element.capTable = (CapTableReader *)0x0;
  kj::_::Debug::Fault::init
            (&f,(EVP_PKEY_CTX *)
                "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static SegmentAnd<word*> setListPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, ListReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto totalSize = assertMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(
        roundBitsUpToWords(upgradeBound<uint64_t>(value.elementCount) * value.step),
        []() { KJ_FAIL_ASSERT("encountered impossibly long struct list ListReader"); });

    if (value.elementSize != ElementSize::INLINE_COMPOSITE) {
      // List of non-structs.
      word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::LIST, orphanArena);

      if (value.elementSize == ElementSize::POINTER) {
        // List of pointers.
        ref->listRef.set(ElementSize::POINTER, value.elementCount);
        for (auto i: kj::zeroTo(value.elementCount * (ONE * POINTERS / ELEMENTS))) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(ptr) + i,
                      value.segment, value.capTable,
                      reinterpret_cast<const WirePointer*>(value.ptr) + i,
                      value.nestingLimit, nullptr, canonical);
        }
      } else {
        // List of data.
        ref->listRef.set(value.elementSize, value.elementCount);

        auto wholeByteSize =
          assertMax(MAX_SEGMENT_WORDS * BYTES_PER_WORD,
            upgradeBound<uint64_t>(value.elementCount) * value.step / BITS_PER_BYTE,
            []() { KJ_FAIL_ASSERT("encountered impossibly long data ListReader"); });
        copyMemory(reinterpret_cast<byte*>(ptr), value.ptr, wholeByteSize);
        auto leftoverBits =
          (upgradeBound<uint64_t>(value.elementCount) * value.step) % BITS_PER_BYTE;
        if (leftoverBits > ZERO * BITS) {
          // We need to copy a partial byte.
          uint8_t mask = (1 << unbound(leftoverBits / BITS)) - 1;
          *((reinterpret_cast<byte*>(ptr)) + wholeByteSize) = mask & *(value.ptr + wholeByteSize);
        }
      }

      return { segment, ptr };
    } else {
      // List of structs.
      StructDataWordCount declDataSize = value.structDataSize / BITS_PER_WORD;
      StructPointerCount declPointerCount = value.structPointerCount;

      StructDataWordCount dataSize = ZERO * WORDS;
      StructPointerCount ptrCount = ZERO * POINTERS;

      if (canonical) {
        for (auto i: kj::zeroTo(value.elementCount)) {
          auto element = value.getStructElement(i);

          // Truncate the data section
          auto data = element.getDataSectionAsBlob();
          auto end = data.end();
          while (end > data.begin() && end[-1] == 0) --end;
          dataSize = kj::max(dataSize, roundBytesUpToWords(
              intervalLength(data.begin(), end, MAX_STUCT_DATA_WORDS * BYTES_PER_WORD)));

          // Truncate pointer section
          const WirePointer* ptr = element.pointers + element.pointerCount;
          while (ptr > element.pointers && ptr[-1].isNull()) --ptr;
          ptrCount = kj::max(ptrCount,
              intervalLength(element.pointers, ptr, MAX_STRUCT_POINTER_COUNT));
        }
        auto newTotalSize = (dataSize + upgradeBound<uint64_t>(ptrCount) * WORDS_PER_POINTER)
            / ELEMENTS * value.elementCount;
        KJ_ASSERT(newTotalSize <= totalSize);  // we've only removed data!
        totalSize = assumeMax<kj::maxValueForBits<SEGMENT_WORD_COUNT_BITS>() - 1>(newTotalSize);
      } else {
        dataSize = declDataSize;
        ptrCount = declPointerCount;
      }

      KJ_DASSERT(value.structDataSize % BITS_PER_WORD == ZERO * BITS);
      word* ptr = allocate(ref, segment, capTable, totalSize + POINTER_SIZE_IN_WORDS,
                           WirePointer::LIST, orphanArena);
      ref->listRef.setInlineComposite(totalSize);

      WirePointer* tag = reinterpret_cast<WirePointer*>(ptr);
      tag->setKindAndInlineCompositeListElementCount(WirePointer::STRUCT, value.elementCount);
      tag->structRef.set(dataSize, ptrCount);
      word* dst = ptr + POINTER_SIZE_IN_WORDS;

      const word* src = reinterpret_cast<const word*>(value.ptr);
      for (auto i KJ_UNUSED: kj::zeroTo(value.elementCount)) {
        copyMemory(dst, src, dataSize);
        dst += dataSize;
        src += declDataSize;

        for (auto j: kj::zeroTo(ptrCount)) {
          copyPointer(segment, capTable, reinterpret_cast<WirePointer*>(dst) + j,
              value.segment, value.capTable, reinterpret_cast<const WirePointer*>(src) + j,
              value.nestingLimit, nullptr, canonical);
        }
        dst += ptrCount * WORDS_PER_POINTER;
        src += declPointerCount * WORDS_PER_POINTER;
      }

      return { segment, ptr };
    }
  }